

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemException.cpp
# Opt level: O0

char * __thiscall phpconvert::SystemException::what(SystemException *this)

{
  ExType EVar1;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  char *out;
  string str;
  stringstream local_198 [8];
  stringstream msg;
  ostream local_188 [376];
  SystemException *local_10;
  SystemException *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  EVar1 = this->code;
  if (EVar1 == INVALID_PARAMETERS) {
    std::operator<<(local_188,"Invalid parameters\n");
    std::operator<<(local_188,"Usage: phpconvert(.exe) <option(s)>\n");
    std::operator<<(local_188,"Options:\n");
    std::operator<<(local_188,"\t-d,\tSpecify the source directory\n");
    std::operator<<(local_188,"\t-o,\tSpecify the output directory\n");
    std::operator<<(local_188,"\t-r,\tProcess directories recursive");
  }
  else if (EVar1 == CANT_OPEN_DIRECTORY) {
    std::operator<<(local_188,"Cant\'t open directory or directory not found.\n");
  }
  else if (EVar1 == FATAL) {
    std::operator<<(local_188,"Application has crashed !");
  }
  else {
    std::operator<<(local_188,"Unknonw error");
  }
  std::__cxx11::stringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar3 = strlen(pcVar2);
  pcVar2 = (char *)operator_new__(sVar3 + 1);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar2,__src);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::stringstream::~stringstream(local_198);
  return pcVar2;
}

Assistant:

const char *SystemException::what() const throw() {
        stringstream msg;

        switch (code) {
            case INVALID_PARAMETERS:
                msg << "Invalid parameters\n";
                msg << "Usage: phpconvert(.exe) <option(s)>\n";
                msg << "Options:\n";
                msg << "\t-d,\tSpecify the source directory\n";
                msg << "\t-o,\tSpecify the output directory\n";
                msg << "\t-r,\tProcess directories recursive";
                break;
            case CANT_OPEN_DIRECTORY:
                msg << "Cant't open directory or directory not found.\n";
                break;
            case FATAL:
                msg << "Application has crashed !";
                break;
            default:
                msg << "Unknonw error";
                break;
        }
        string str = msg.str();
         const char *out = new char[strlen(str.c_str())+1];
//        out = str.c_str(); //@todo seems to be pointer as well, make it field
        std::strcpy(const_cast<char *>(out), str.c_str());
        return out;
    }